

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time.cc
# Opt level: O3

bool absl::lts_20240722::ParseLenientCivilTime(string_view s,CivilHour *c)

{
  bool bVar1;
  CivilMinute *in_RCX;
  lts_20240722 *this;
  string_view s_00;
  string_view s_01;
  string_view s_02;
  string_view s_03;
  string_view s_04;
  string_view s_05;
  int_least64_t local_28;
  uint uStack_20;
  uint uStack_1c;
  
  s_00._M_len = s._M_str;
  this = (lts_20240722 *)s._M_len;
  s_00._M_str = (char *)c;
  bVar1 = ParseCivilTime(this,s_00,(CivilHour *)in_RCX);
  if (!bVar1) {
    local_28 = 0x7b2;
    uStack_20 = 0x101;
    uStack_1c = uStack_1c & 0xffffff00;
    s_01._M_str = (char *)&local_28;
    s_01._M_len = (size_t)s_00._M_len;
    bVar1 = ParseCivilTime(this,s_01,(CivilDay *)in_RCX);
    if (!bVar1) {
      local_28 = 0x7b2;
      uStack_20 = 0x101;
      uStack_1c = uStack_1c & 0xffffff00;
      s_02._M_str = (char *)&local_28;
      s_02._M_len = (size_t)s_00._M_len;
      bVar1 = ParseCivilTime(this,s_02,(CivilSecond *)in_RCX);
      if (!bVar1) {
        local_28 = 0x7b2;
        uStack_20 = 0x101;
        uStack_1c = uStack_1c & 0xffffff00;
        s_03._M_str = (char *)&local_28;
        s_03._M_len = (size_t)s_00._M_len;
        bVar1 = ParseCivilTime(this,s_03,(CivilHour *)in_RCX);
        if (bVar1) {
          (c->f_).y = local_28;
          (c->f_).m = (char)uStack_20;
          (c->f_).d = (char)(uStack_20 >> 8);
          (c->f_).hh = (char)(uStack_20 >> 0x10);
          (c->f_).mm = (char)(uStack_20 >> 0x18);
          (c->f_).ss = (char)uStack_1c;
          *(int3 *)&(c->f_).field_0xd = (int3)(uStack_1c >> 8);
          return true;
        }
        local_28 = 0x7b2;
        uStack_20 = 0x101;
        uStack_1c = uStack_1c & 0xffffff00;
        s_04._M_str = (char *)&local_28;
        s_04._M_len = (size_t)s_00._M_len;
        bVar1 = ParseCivilTime(this,s_04,(CivilMonth *)in_RCX);
        if (!bVar1) {
          local_28 = 0x7b2;
          uStack_20 = 0x101;
          uStack_1c = uStack_1c & 0xffffff00;
          s_05._M_str = (char *)&local_28;
          s_05._M_len = (size_t)s_00._M_len;
          bVar1 = ParseCivilTime(this,s_05,in_RCX);
          if (!bVar1) {
            bVar1 = (anonymous_namespace)::
                    ParseAs<absl::lts_20240722::time_internal::cctz::detail::civil_time<absl::lts_20240722::time_internal::year_tag>,absl::lts_20240722::time_internal::cctz::detail::civil_time<absl::lts_20240722::time_internal::hour_tag>>
                              (s,c);
            return bVar1;
          }
        }
      }
    }
    uStack_20 = uStack_20 & 0xffffff;
    (c->f_).y = local_28;
    (c->f_).m = (char)uStack_20;
    (c->f_).d = (char)(uStack_20 >> 8);
    (c->f_).hh = (char)(uStack_20 >> 0x10);
    (c->f_).mm = (char)(uStack_20 >> 0x18);
    (c->f_).ss = '\0';
  }
  return true;
}

Assistant:

bool ParseLenientCivilTime(string_view s, CivilHour* c) {
  return ParseLenient(s, c);
}